

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  bool bVar1;
  ulong uVar2;
  UnitTest *pUVar3;
  char *pcVar4;
  string *psVar5;
  string *in_RDI;
  string local_290 [32];
  FilePath local_270;
  undefined1 local_250 [8];
  FilePath result;
  string local_228;
  FilePath local_208;
  allocator<char> local_1e1;
  string local_1e0;
  FilePath local_1c0;
  FilePath local_1a0;
  allocator<char> local_179;
  string local_178;
  undefined1 local_158 [8];
  FilePath output_name;
  string local_130;
  FilePath local_110;
  allocator<char> local_e9;
  string local_e8;
  FilePath local_c8;
  FilePath local_a8;
  char *local_88;
  char *colon;
  string local_78 [32];
  string local_58 [8];
  string format;
  char *gtest_output_flag;
  string s;
  
  std::__cxx11::string::string((string *)&gtest_output_flag,(string *)FLAGS_gtest_output_abi_cxx11_)
  ;
  format.field_2._8_8_ = std::__cxx11::string::c_str();
  GetOutputFormat_abi_cxx11_();
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_78,"xml",(allocator<char> *)((long)&colon + 7));
    std::__cxx11::string::operator=(local_58,local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&colon + 7));
  }
  local_88 = strchr((char *)format.field_2._8_8_,0x3a);
  if (local_88 == (char *)0x0) {
    pUVar3 = UnitTest::GetInstance();
    pcVar4 = UnitTest::original_working_dir(pUVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,pcVar4,&local_e9);
    FilePath::FilePath(&local_c8,&local_e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"test_detail",
               (allocator<char> *)(output_name.pathname_.field_2._M_local_buf + 0xf));
    FilePath::FilePath(&local_110,&local_130);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    FilePath::MakeFileName(&local_a8,&local_c8,&local_110,0,pcVar4);
    psVar5 = FilePath::string_abi_cxx11_(&local_a8);
    std::__cxx11::string::string((string *)in_RDI,(string *)psVar5);
    FilePath::~FilePath(&local_a8);
    FilePath::~FilePath(&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator
              ((allocator<char> *)(output_name.pathname_.field_2._M_local_buf + 0xf));
    FilePath::~FilePath(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    output_name.pathname_.field_2._8_4_ = 1;
  }
  else {
    pcVar4 = local_88 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,pcVar4,&local_179);
    FilePath::FilePath((FilePath *)local_158,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
    bVar1 = FilePath::IsAbsolutePath((FilePath *)local_158);
    if (!bVar1) {
      pUVar3 = UnitTest::GetInstance();
      pcVar4 = UnitTest::original_working_dir(pUVar3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,pcVar4,&local_1e1);
      FilePath::FilePath(&local_1c0,&local_1e0);
      pcVar4 = local_88 + 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,pcVar4,
                 (allocator<char> *)(result.pathname_.field_2._M_local_buf + 0xf));
      FilePath::FilePath(&local_208,&local_228);
      FilePath::ConcatPaths(&local_1a0,&local_1c0,&local_208);
      FilePath::operator=((FilePath *)local_158,&local_1a0);
      FilePath::~FilePath(&local_1a0);
      FilePath::~FilePath(&local_208);
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator
                ((allocator<char> *)(result.pathname_.field_2._M_local_buf + 0xf));
      FilePath::~FilePath(&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator(&local_1e1);
    }
    bVar1 = FilePath::IsDirectory((FilePath *)local_158);
    if (bVar1) {
      GetCurrentExecutableName();
      GetOutputFormat_abi_cxx11_();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      FilePath::GenerateUniqueFileName
                ((FilePath *)local_250,(FilePath *)local_158,&local_270,pcVar4);
      std::__cxx11::string::~string(local_290);
      FilePath::~FilePath(&local_270);
      psVar5 = FilePath::string_abi_cxx11_((FilePath *)local_250);
      std::__cxx11::string::string((string *)in_RDI,(string *)psVar5);
      output_name.pathname_.field_2._8_4_ = 1;
      FilePath::~FilePath((FilePath *)local_250);
    }
    else {
      psVar5 = FilePath::string_abi_cxx11_((FilePath *)local_158);
      std::__cxx11::string::string((string *)in_RDI,(string *)psVar5);
      output_name.pathname_.field_2._8_4_ = 1;
    }
    FilePath::~FilePath((FilePath *)local_158);
  }
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)&gtest_output_flag);
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  std::string s = GTEST_FLAG_GET(output);
  const char* const gtest_output_flag = s.c_str();

  std::string format = GetOutputFormat();
  if (format.empty()) format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == nullptr)
    return internal::FilePath::MakeFileName(
               internal::FilePath(
                   UnitTest::GetInstance()->original_working_dir()),
               internal::FilePath(kDefaultOutputFile), 0, format.c_str())
        .string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory()) return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}